

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsa.c
# Opt level: O2

int mbedtls_rsa_export_crt(mbedtls_rsa_context *ctx,mbedtls_mpi *DP,mbedtls_mpi *DQ,mbedtls_mpi *QP)

{
  int iVar1;
  
  iVar1 = mbedtls_mpi_cmp_int(&ctx->N,0);
  if (iVar1 == 0) {
    return -0x4080;
  }
  iVar1 = mbedtls_mpi_cmp_int(&ctx->P,0);
  if (iVar1 == 0) {
    return -0x4080;
  }
  iVar1 = mbedtls_mpi_cmp_int(&ctx->Q,0);
  if (iVar1 == 0) {
    return -0x4080;
  }
  iVar1 = mbedtls_mpi_cmp_int(&ctx->D,0);
  if (iVar1 != 0) {
    iVar1 = mbedtls_mpi_cmp_int(&ctx->E,0);
    if (iVar1 == 0) {
      return -0x4080;
    }
    if (((DP == (mbedtls_mpi *)0x0) || (iVar1 = mbedtls_mpi_copy(DP,&ctx->DP), iVar1 == 0)) &&
       ((DQ == (mbedtls_mpi *)0x0 || (iVar1 = mbedtls_mpi_copy(DQ,&ctx->DQ), iVar1 == 0)))) {
      if (QP == (mbedtls_mpi *)0x0) {
        return 0;
      }
      iVar1 = mbedtls_mpi_copy(QP,&ctx->QP);
      if (iVar1 == 0) {
        return 0;
      }
    }
    return iVar1 + -0x4080;
  }
  return -0x4080;
}

Assistant:

int mbedtls_rsa_export_crt( const mbedtls_rsa_context *ctx,
                            mbedtls_mpi *DP, mbedtls_mpi *DQ, mbedtls_mpi *QP )
{
    int ret;

    /* Check if key is private or public */
    int is_priv =
        mbedtls_mpi_cmp_int( &ctx->N, 0 ) != 0 &&
        mbedtls_mpi_cmp_int( &ctx->P, 0 ) != 0 &&
        mbedtls_mpi_cmp_int( &ctx->Q, 0 ) != 0 &&
        mbedtls_mpi_cmp_int( &ctx->D, 0 ) != 0 &&
        mbedtls_mpi_cmp_int( &ctx->E, 0 ) != 0;

    if( !is_priv )
        return( MBEDTLS_ERR_RSA_BAD_INPUT_DATA );

#if !defined(MBEDTLS_RSA_NO_CRT)
    /* Export all requested blinding parameters. */
    if( ( DP != NULL && ( ret = mbedtls_mpi_copy( DP, &ctx->DP ) ) != 0 ) ||
        ( DQ != NULL && ( ret = mbedtls_mpi_copy( DQ, &ctx->DQ ) ) != 0 ) ||
        ( QP != NULL && ( ret = mbedtls_mpi_copy( QP, &ctx->QP ) ) != 0 ) )
    {
        return( MBEDTLS_ERR_RSA_BAD_INPUT_DATA + ret );
    }
#else
    if( ( ret = mbedtls_rsa_deduce_crt( &ctx->P, &ctx->Q, &ctx->D,
                                        DP, DQ, QP ) ) != 0 )
    {
        return( MBEDTLS_ERR_RSA_BAD_INPUT_DATA + ret );
    }
#endif

    return( 0 );
}